

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

bool __thiscall llvm::DWARFVerifier::DieRangeInfo::intersects(DieRangeInfo *this,DieRangeInfo *RHS)

{
  ulong uVar1;
  bool bVar2;
  pointer pDVar3;
  reference RHS_00;
  bool local_49;
  __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  local_40;
  const_iterator E2;
  const_iterator I2;
  const_iterator E1;
  const_iterator I1;
  DieRangeInfo *RHS_local;
  DieRangeInfo *this_local;
  
  E1 = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::begin
                 (&this->Ranges);
  I2 = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::end
                 (&this->Ranges);
  E2 = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::begin
                 (&RHS->Ranges);
  local_40._M_current =
       (DWARFAddressRange *)
       std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::end
                 (&RHS->Ranges);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&E1,&I2);
    local_49 = false;
    if (bVar2) {
      local_49 = __gnu_cxx::operator!=(&E2,&local_40);
    }
    if (local_49 == false) break;
    pDVar3 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             ::operator->(&E1);
    RHS_00 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             ::operator*(&E2);
    bVar2 = DWARFAddressRange::intersects(pDVar3,RHS_00);
    if (bVar2) {
      return true;
    }
    pDVar3 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             ::operator->(&E1);
    uVar1 = pDVar3->LowPC;
    pDVar3 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             ::operator->(&E2);
    if (uVar1 < pDVar3->LowPC) {
      __gnu_cxx::
      __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
      ::operator++(&E1);
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
      ::operator++(&E2);
    }
  }
  return false;
}

Assistant:

bool DWARFVerifier::DieRangeInfo::intersects(const DieRangeInfo &RHS) const {
  auto I1 = Ranges.begin(), E1 = Ranges.end();
  auto I2 = RHS.Ranges.begin(), E2 = RHS.Ranges.end();
  while (I1 != E1 && I2 != E2) {
    if (I1->intersects(*I2))
      return true;
    if (I1->LowPC < I2->LowPC)
      ++I1;
    else
      ++I2;
  }
  return false;
}